

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
mxx::all2all<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int *msgs,size_t size,
                 comm *comm)

{
  comm *size_00;
  size_t msgs_00;
  int iVar1;
  reference out;
  allocator<int> local_2a;
  undefined1 local_29;
  comm *local_28;
  comm *comm_local;
  size_t size_local;
  int *msgs_local;
  vector<int,_std::allocator<int>_> *result;
  
  local_29 = 0;
  local_28 = comm;
  comm_local = (comm *)size;
  size_local = (size_t)msgs;
  msgs_local = (int *)__return_storage_ptr__;
  iVar1 = mxx::comm::size(comm);
  std::allocator<int>::allocator(&local_2a);
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,size * (long)iVar1,&local_2a);
  std::allocator<int>::~allocator(&local_2a);
  msgs_00 = size_local;
  size_00 = comm_local;
  out = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,0);
  all2all<int>((int *)msgs_00,(size_t)size_00,out,local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2all(const T* msgs, size_t size, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(size*comm.size());
    all2all(msgs, size, &result[0], comm);
    return result;
}